

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_ameth.c
# Opt level: O0

int ec_pkey_export_to(EVP_PKEY *from,void *to_keydata,OSSL_FUNC_keymgmt_import_fn *importer,
                     OSSL_LIB_CTX *libctx,char *propq)

{
  EC_KEY *key;
  int iVar1;
  EC_GROUP *genbuf;
  OSSL_PARAM_BLD *tmpl_00;
  BN_CTX *bld;
  BIGNUM *pBVar2;
  EC_GROUP *group;
  size_t sVar3;
  code *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int ecdh_cofactor_mode;
  int ecbits;
  size_t sz;
  BN_CTX *bnctx;
  int rv;
  int selection;
  EC_POINT *pub_point;
  BIGNUM *priv_key;
  OSSL_PARAM *params;
  OSSL_PARAM_BLD *tmpl;
  size_t pub_key_buflen;
  uchar *gen_buf;
  uchar *pub_key_buf;
  EC_GROUP *ecg;
  EC_KEY *eckey;
  OSSL_LIB_CTX *in_stack_ffffffffffffff58;
  void **key_00;
  OSSL_PARAM *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uchar **in_stack_ffffffffffffff70;
  int iVar4;
  uint uVar5;
  char *propq_00;
  OSSL_LIB_CTX *libctx_00;
  OSSL_PARAM *pOVar6;
  EC_GROUP *in_stack_ffffffffffffffa8;
  void *local_50;
  void *local_48;
  
  local_48 = (void *)0x0;
  local_50 = (void *)0x0;
  pOVar6 = (OSSL_PARAM *)0x0;
  libctx_00 = (OSSL_LIB_CTX *)0x0;
  propq_00 = (char *)0x0;
  uVar5 = 0;
  iVar4 = 0;
  if (((in_RDI == 0) || (key = *(EC_KEY **)(in_RDI + 0x20), key == (EC_KEY *)0x0)) ||
     (genbuf = EC_KEY_get0_group(key), genbuf == (EC_GROUP *)0x0)) {
    return 0;
  }
  tmpl_00 = OSSL_PARAM_BLD_new();
  if (tmpl_00 == (OSSL_PARAM_BLD *)0x0) {
    return 0;
  }
  bld = BN_CTX_new_ex(in_stack_ffffffffffffff58);
  if (bld != (BN_CTX *)0x0) {
    BN_CTX_start((BN_CTX *)bld);
    key_00 = &local_50;
    iVar1 = ossl_ec_group_todata
                      (in_stack_ffffffffffffffa8,tmpl_00,pOVar6,libctx_00,propq_00,
                       (BN_CTX *)CONCAT44(uVar5,iVar4),(uchar **)genbuf);
    if (iVar1 != 0) {
      uVar5 = uVar5 | 4;
      pBVar2 = EC_KEY_get0_private_key(key);
      group = (EC_GROUP *)EC_KEY_get0_public_key(key);
      if (group != (EC_GROUP *)0x0) {
        sVar3 = EC_POINT_point2buf(group,(EC_POINT *)CONCAT44(uVar5,iVar4),
                                   (point_conversion_form_t)((ulong)bld >> 0x20),
                                   in_stack_ffffffffffffff70,
                                   (BN_CTX *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if ((sVar3 == 0) ||
           (iVar1 = OSSL_PARAM_BLD_push_octet_string
                              ((OSSL_PARAM_BLD *)bld,(char *)in_stack_ffffffffffffff70,
                               (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                               ,(size_t)in_stack_ffffffffffffff60), iVar1 == 0)) goto LAB_003d71fe;
        uVar5 = uVar5 | 2;
      }
      if (pBVar2 != (BIGNUM *)0x0) {
        iVar1 = EC_GROUP_order_bits((EC_GROUP *)0x3d712e);
        if ((iVar1 < 1) ||
           (iVar1 = OSSL_PARAM_BLD_push_BN_pad
                              ((OSSL_PARAM_BLD *)bld,(char *)(long)((iVar1 + 7) / 8),
                               (BIGNUM *)CONCAT44(iVar1,in_stack_ffffffffffffff68),
                               (size_t)in_stack_ffffffffffffff60), iVar1 == 0)) goto LAB_003d71fe;
        uVar5 = uVar5 | 1;
        EC_KEY_get_flags(key);
        iVar1 = OSSL_PARAM_BLD_push_int
                          ((OSSL_PARAM_BLD *)in_stack_ffffffffffffff60,(char *)key_00,0);
        if (iVar1 == 0) goto LAB_003d71fe;
        uVar5 = uVar5 | 0x80;
      }
      pOVar6 = OSSL_PARAM_BLD_to_param((OSSL_PARAM_BLD *)pOVar6);
      iVar4 = (*in_RDX)(in_RSI,uVar5,pOVar6);
    }
  }
LAB_003d71fe:
  OSSL_PARAM_BLD_free((OSSL_PARAM_BLD *)0x3d7208);
  OSSL_PARAM_free(in_stack_ffffffffffffff60);
  CRYPTO_free(local_48);
  CRYPTO_free(local_50);
  BN_CTX_end((BN_CTX *)bld);
  BN_CTX_free((BN_CTX *)bld);
  return iVar4;
}

Assistant:

static
int ec_pkey_export_to(const EVP_PKEY *from, void *to_keydata,
                      OSSL_FUNC_keymgmt_import_fn *importer,
                      OSSL_LIB_CTX *libctx, const char *propq)
{
    const EC_KEY *eckey = NULL;
    const EC_GROUP *ecg = NULL;
    unsigned char *pub_key_buf = NULL, *gen_buf = NULL;
    size_t pub_key_buflen;
    OSSL_PARAM_BLD *tmpl;
    OSSL_PARAM *params = NULL;
    const BIGNUM *priv_key = NULL;
    const EC_POINT *pub_point = NULL;
    int selection = 0;
    int rv = 0;
    BN_CTX *bnctx = NULL;

    if (from == NULL
            || (eckey = from->pkey.ec) == NULL
            || (ecg = EC_KEY_get0_group(eckey)) == NULL)
        return 0;

    tmpl = OSSL_PARAM_BLD_new();
    if (tmpl == NULL)
        return 0;

    /*
     * EC_POINT_point2buf() can generate random numbers in some
     * implementations so we need to ensure we use the correct libctx.
     */
    bnctx = BN_CTX_new_ex(libctx);
    if (bnctx == NULL)
        goto err;
    BN_CTX_start(bnctx);

    /* export the domain parameters */
    if (!ossl_ec_group_todata(ecg, tmpl, NULL, libctx, propq, bnctx, &gen_buf))
        goto err;
    selection |= OSSL_KEYMGMT_SELECT_DOMAIN_PARAMETERS;

    priv_key = EC_KEY_get0_private_key(eckey);
    pub_point = EC_KEY_get0_public_key(eckey);

    if (pub_point != NULL) {
        /* convert pub_point to a octet string according to the SECG standard */
        if ((pub_key_buflen = EC_POINT_point2buf(ecg, pub_point,
                                                 POINT_CONVERSION_COMPRESSED,
                                                 &pub_key_buf, bnctx)) == 0
            || !OSSL_PARAM_BLD_push_octet_string(tmpl,
                                                 OSSL_PKEY_PARAM_PUB_KEY,
                                                 pub_key_buf,
                                                 pub_key_buflen))
            goto err;
        selection |= OSSL_KEYMGMT_SELECT_PUBLIC_KEY;
    }

    if (priv_key != NULL) {
        size_t sz;
        int ecbits;
        int ecdh_cofactor_mode;

        /*
         * Key import/export should never leak the bit length of the secret
         * scalar in the key.
         *
         * For this reason, on export we use padded BIGNUMs with fixed length.
         *
         * When importing we also should make sure that, even if short lived,
         * the newly created BIGNUM is marked with the BN_FLG_CONSTTIME flag as
         * soon as possible, so that any processing of this BIGNUM might opt for
         * constant time implementations in the backend.
         *
         * Setting the BN_FLG_CONSTTIME flag alone is never enough, we also have
         * to preallocate the BIGNUM internal buffer to a fixed public size big
         * enough that operations performed during the processing never trigger
         * a realloc which would leak the size of the scalar through memory
         * accesses.
         *
         * Fixed Length
         * ------------
         *
         * The order of the large prime subgroup of the curve is our choice for
         * a fixed public size, as that is generally the upper bound for
         * generating a private key in EC cryptosystems and should fit all valid
         * secret scalars.
         *
         * For padding on export we just use the bit length of the order
         * converted to bytes (rounding up).
         *
         * For preallocating the BIGNUM storage we look at the number of "words"
         * required for the internal representation of the order, and we
         * preallocate 2 extra "words" in case any of the subsequent processing
         * might temporarily overflow the order length.
         */
        ecbits = EC_GROUP_order_bits(ecg);
        if (ecbits <= 0)
            goto err;

        sz = (ecbits + 7 ) / 8;
        if (!OSSL_PARAM_BLD_push_BN_pad(tmpl,
                                        OSSL_PKEY_PARAM_PRIV_KEY,
                                        priv_key, sz))
            goto err;
        selection |= OSSL_KEYMGMT_SELECT_PRIVATE_KEY;

        /*
         * The ECDH Cofactor Mode is defined only if the EC_KEY actually
         * contains a private key, so we check for the flag and export it only
         * in this case.
         */
        ecdh_cofactor_mode =
            (EC_KEY_get_flags(eckey) & EC_FLAG_COFACTOR_ECDH) ? 1 : 0;

        /* Export the ECDH_COFACTOR_MODE parameter */
        if (!OSSL_PARAM_BLD_push_int(tmpl,
                                     OSSL_PKEY_PARAM_USE_COFACTOR_ECDH,
                                     ecdh_cofactor_mode))
            goto err;
        selection |= OSSL_KEYMGMT_SELECT_OTHER_PARAMETERS;
    }

    params = OSSL_PARAM_BLD_to_param(tmpl);

    /* We export, the provider imports */
    rv = importer(to_keydata, selection, params);

 err:
    OSSL_PARAM_BLD_free(tmpl);
    OSSL_PARAM_free(params);
    OPENSSL_free(pub_key_buf);
    OPENSSL_free(gen_buf);
    BN_CTX_end(bnctx);
    BN_CTX_free(bnctx);
    return rv;
}